

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double __thiscall llvm::detail::IEEEFloat::convertToDouble(IEEEFloat *this)

{
  double dVar1;
  undefined1 local_20 [8];
  APInt api;
  IEEEFloat *this_local;
  
  api._8_8_ = this;
  if (this->semantics != (fltSemantics *)semIEEEdouble) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEdouble && \"Float semantics are not IEEEdouble\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbd4,"double llvm::detail::IEEEFloat::convertToDouble() const");
  }
  bitcastToAPInt((IEEEFloat *)local_20);
  dVar1 = APInt::bitsToDouble((APInt *)local_20);
  APInt::~APInt((APInt *)local_20);
  return dVar1;
}

Assistant:

double IEEEFloat::convertToDouble() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEdouble &&
         "Float semantics are not IEEEdouble");
  APInt api = bitcastToAPInt();
  return api.bitsToDouble();
}